

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O2

void printhash(BuildCtx *ctx,uint32_t *htab,uint32_t sz)

{
  ulong uVar1;
  
  fprintf((FILE *)ctx->fp,"static const uint32_t fold_hash[%d] = {\n0x%08x",(ulong)(sz + 1),
          (ulong)*htab);
  for (uVar1 = 1; sz + 1 != uVar1; uVar1 = uVar1 + 1) {
    fprintf((FILE *)ctx->fp,",\n0x%08x",(ulong)htab[uVar1]);
  }
  fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
  return;
}

Assistant:

static void printhash(BuildCtx *ctx, uint32_t *htab, uint32_t sz)
{
  uint32_t i;
  fprintf(ctx->fp, "static const uint32_t fold_hash[%d] = {\n0x%08x",
	  sz+1, htab[0]);
  for (i = 1; i < sz+1; i++)
    fprintf(ctx->fp, ",\n0x%08x", htab[i]);
  fprintf(ctx->fp, "\n};\n\n");
}